

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O0

void __thiscall tcmalloc::ThreadCache::Free(ThreadCache *this,void *ptr,uint64_t cl)

{
  int32_t iVar1;
  int iVar2;
  uint64_t uVar3;
  size_t sVar4;
  int length;
  uint64_t cl_local;
  void *ptr_local;
  ThreadCache *this_local;
  
  if (cl == 0 || 0x55 < cl) {
    __assert_fail("0 < cl && cl < kMaxClass",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/thread_cache.hpp"
                  ,0x32,"void tcmalloc::ThreadCache::Free(void *, uint64_t)");
  }
  iVar1 = ThreadCacheFreeList::object_bytes(this->freelists_ + cl);
  this->size_ = (long)iVar1 + this->size_;
  uVar3 = ClassSize((int)cl);
  this->total_free_ = uVar3 + this->total_free_;
  iVar2 = ThreadCacheFreeList::Push(this->freelists_ + cl,ptr);
  sVar4 = ThreadCacheFreeList::max_length(this->freelists_ + cl);
  if (sVar4 < (ulong)(long)iVar2) {
    ListTooLong(this,this->freelists_ + cl);
  }
  else if (this->max_size_ < this->size_) {
    Scavenge(this);
  }
  return;
}

Assistant:

void Free(void* ptr, uint64_t cl) {
        assert(0 < cl && cl < kMaxClass);
        size_ += freelists_[cl].object_bytes();
        total_free_ += ClassSize(cl);
        int length = freelists_[cl].Push(ptr);
        if (length > freelists_[cl].max_length()) {
            ListTooLong(freelists_[cl]);
            return;
        }
        if (size_ > max_size_){
            Scavenge();
        }
    }